

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4-compression.cc
# Opt level: O3

size_t tinyusdz::LZ4Compression::CompressToBuffer
                 (char *input,char *compressed,size_t inputSize,string *err)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int maxOutputSize;
  size_t sVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong uVar8;
  int *piVar9;
  int *piVar10;
  char cVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  string __str_1;
  string __str;
  long *local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  char *local_98;
  ulong *local_90;
  uint local_88;
  undefined4 uStack_84;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  ulong *local_50;
  uint local_48;
  ulong local_40 [2];
  
  if (inputSize < 0x3e82000001) {
    if (inputSize < 0x7e000001) {
      *compressed = '\0';
      sVar4 = GetCompressedBufferSize(inputSize);
      iVar3 = LZ4_compress_default(input,compressed + 1,(int)inputSize,(int)sVar4);
      piVar9 = (int *)(compressed + (long)iVar3 + 1);
LAB_003aaa2e:
      return (long)piVar9 - (long)compressed;
    }
    uVar8 = inputSize / 0x7e000000;
    uVar14 = inputSize % 0x7e000000;
    uVar13 = (uVar14 != 0) + uVar8;
    if (uVar13 < 0x80) {
      *compressed = (char)uVar13;
      piVar9 = (int *)(compressed + 1);
      local_98 = compressed;
      do {
        piVar10 = piVar9;
        iVar3 = LZ4_compressBound(0x7e000000);
        iVar3 = LZ4_compress_default(input,(char *)(piVar10 + 1),0x7e000000,iVar3);
        *piVar10 = iVar3;
        piVar9 = (int *)((long)piVar10 + (long)iVar3 + 4);
        input = input + 0x7e000000;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
      if (uVar14 != 0) {
        maxOutputSize = LZ4_compressBound((int)uVar14);
        iVar3 = LZ4_compress_default
                          (input,(char *)((long)piVar10 + (long)iVar3 + 8),(int)uVar14,maxOutputSize
                          );
        *piVar9 = iVar3;
        piVar9 = (int *)((long)piVar9 + (long)iVar3 + 4);
      }
      compressed = local_98;
      if (0x7f < uVar13) {
        return 0;
      }
      goto LAB_003aaa2e;
    }
    if (err == (string *)0x0) {
      return 0;
    }
    local_d8 = &local_c8;
    ::std::__cxx11::string::_M_construct((ulong)&local_d8,'\x03');
    ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d8,(uint)local_d0,0x80);
    puVar6 = (undefined8 *)::std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x5e5d18);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_e8 = *plVar5;
      uStack_e0 = puVar6[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *plVar5;
      local_f8 = (long *)*puVar6;
    }
    local_f0 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_f8);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_a8 = *plVar7;
      lStack_a0 = plVar5[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar7;
      local_b8 = (long *)*plVar5;
    }
    local_b0 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)err,(string *)&local_b8);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    local_40[0] = local_c8;
    puVar12 = local_d8;
    if (local_d8 == &local_c8) {
      return 0;
    }
    goto LAB_003aae32;
  }
  if (err == (string *)0x0) {
    return 0;
  }
  sVar4 = inputSize;
  cVar2 = '\x04';
  do {
    cVar11 = cVar2;
    if (sVar4 < 100) {
      cVar11 = cVar11 + -2;
      goto LAB_003aab77;
    }
    if (sVar4 < 1000) {
      cVar11 = cVar11 + -1;
      goto LAB_003aab77;
    }
    if (sVar4 < 10000) goto LAB_003aab77;
    bVar1 = 99999 < sVar4;
    sVar4 = sVar4 / 10000;
    cVar2 = cVar11 + '\x04';
  } while (bVar1);
  cVar11 = cVar11 + '\x01';
LAB_003aab77:
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct((ulong)&local_50,cVar11);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_50,local_48,inputSize);
  plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x5e5ccc);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_70);
  puVar12 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar12) {
    local_c8 = *puVar12;
    lStack_c0 = plVar5[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar12;
    local_d8 = (ulong *)*plVar5;
  }
  local_d0 = plVar5[1];
  *plVar5 = (long)puVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_90 = local_80;
  ::std::__cxx11::string::_M_construct((ulong)&local_90,'\f');
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90,local_88,0x3e82000000);
  uVar8 = CONCAT44(uStack_84,local_88) + local_d0;
  uVar13 = 0xf;
  if (local_d8 != &local_c8) {
    uVar13 = local_c8;
  }
  if (uVar13 < uVar8) {
    uVar13 = 0xf;
    if (local_90 != local_80) {
      uVar13 = local_80[0];
    }
    if (uVar13 < uVar8) goto LAB_003aacd6;
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d8);
  }
  else {
LAB_003aacd6:
    puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_90);
  }
  local_f8 = &local_e8;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_e8 = *plVar5;
    uStack_e0 = puVar6[3];
  }
  else {
    local_e8 = *plVar5;
    local_f8 = (long *)*puVar6;
  }
  local_f0 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_f8);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_a8 = *plVar7;
    lStack_a0 = plVar5[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar7;
    local_b8 = (long *)*plVar5;
  }
  local_b0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ::std::__cxx11::string::operator=((string *)err,(string *)&local_b8);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  puVar12 = local_50;
  if (local_50 == local_40) {
    return 0;
  }
LAB_003aae32:
  operator_delete(puVar12,local_40[0] + 1);
  return 0;
}

Assistant:

size_t LZ4Compression::CompressToBuffer(char const *input, char *compressed,
                                        size_t inputSize, std::string *err) {
  if (inputSize > GetMaxInputSize()) {
    if (err) {
      (*err) = "Attempted to compress a buffer of " +
               std::to_string(inputSize) +
               " bytes, "
               "more than the maximum supported " +
               std::to_string(GetMaxInputSize()) + "\n";
    }
    return 0;
  }

  // If it fits in one chunk, just do it.
  char const *const origCompressed = compressed;
  if (inputSize <= LZ4_MAX_INPUT_SIZE) {
    compressed[0] = 0;  // < zero byte means one chunk.
    compressed += 1 + LZ4_compress_default(input, compressed + 1, int(inputSize),
                                           int(GetCompressedBufferSize(inputSize)));
  } else {
    size_t nWholeChunks = inputSize / LZ4_MAX_INPUT_SIZE;
    size_t partChunkSz = inputSize % LZ4_MAX_INPUT_SIZE;
    size_t numChunks = nWholeChunks + (partChunkSz ? 1 : 0);

    if (numChunks > 127) {
      if (err) {
        (*err) = "# of chunks must be less than 127 but got " + std::to_string(numChunks) + "\n";
      }
      return 0;
    }
    *compressed++ = char(numChunks);
    auto writeChunk = [](char const *&_input, char *&_output, size_t size) {
      char *o = _output;
      _output += sizeof(int32_t);
      int32_t n =
          LZ4_compress_default(_input, _output, int(size), LZ4_compressBound(int(size)));
      memcpy(o, &n, sizeof(n));
      _output += n;
      _input += size;
    };
    for (size_t chunk = 0; chunk != nWholeChunks; ++chunk) {
      writeChunk(input, compressed, LZ4_MAX_INPUT_SIZE);
    }
    if (partChunkSz) {
      writeChunk(input, compressed, partChunkSz);
    }
  }

  return size_t(compressed - origCompressed);
}